

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_MovePlayer(player_t *player)

{
  APlayerPawn *pAVar1;
  msecnode_t *pmVar2;
  double dVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar6;
  double sm;
  double fm;
  double friction;
  double local_a8;
  double local_98;
  double local_90;
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  pAVar1 = player->mo;
  if (player->turnticks == '\0') {
    dVar3 = (double)(int)(player->cmd).ucmd.yaw * 0.0054931640625;
  }
  else {
    player->turnticks = player->turnticks + 0xff;
    dVar3 = 20.0;
  }
  (pAVar1->super_AActor).Angles.Yaw.Degrees = dVar3 + (pAVar1->super_AActor).Angles.Yaw.Degrees;
  bVar4 = true;
  if ((((pAVar1->super_AActor).floorz < (pAVar1->super_AActor).__Pos.Z) &&
      (((pAVar1->super_AActor).flags2.Value & 0x800) == 0)) &&
     (((pAVar1->super_AActor).BounceFlags.Value & 0x1000) == 0)) {
    bVar4 = (bool)((byte)((uint)player->cheats >> 0x1e) & 1);
  }
  player->onground = bVar4;
  if ((player->cmd).ucmd.sidemove != 0 || (player->cmd).ucmd.forwardmove != 0) {
    dVar3 = P_GetMoveFactor(&pAVar1->super_AActor,&local_50);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = dVar3;
    local_88._12_4_ = extraout_XMM0_Dd;
    local_a8 = (double)(~-(ulong)(local_50 < 0.90625) & 0x3fa0000000000000 |
                       -(ulong)(local_50 < 0.90625) & (ulong)dVar3);
    if (((player->onground == false) && (((player->mo->super_AActor).flags.Value & 0x200) == 0)) &&
       ((player->mo->super_AActor).waterlevel == 0)) {
      local_88._0_8_ = dVar3 * level.aircontrol;
      local_a8 = local_a8 * level.aircontrol;
    }
    local_90 = (double)(int)(player->cmd).ucmd.forwardmove;
    local_98 = (double)(int)(player->cmd).ucmd.sidemove;
    APlayerPawn::TweakSpeeds(pAVar1,&local_90,&local_98);
    dVar3 = (player->mo->super_AActor).Speed * 0.00390625;
    local_90 = local_90 * dVar3;
    local_98 = dVar3 * local_98;
    if ((player->morphTics == 0) || ((player->mo->PlayerFlags & 4) != 0)) {
      dVar3 = player->crouchfactor;
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
        local_90 = local_90 * dVar3;
        local_98 = local_98 * dVar3;
        local_a8 = local_a8 * dVar3;
      }
    }
    local_78 = local_90 * (double)local_88._0_8_;
    local_68 = local_98 * (double)local_88._0_8_;
    uStack_70 = 0;
    uStack_60 = 0;
    if ((local_78 != 0.0) || (NAN(local_78))) {
      local_40.Degrees = (pAVar1->super_AActor).Angles.Yaw.Degrees;
      P_Bob(player,&local_40,(double)(int)(player->cmd).ucmd.forwardmove * local_a8 * 0.00390625,
            true);
      local_48.Degrees = (pAVar1->super_AActor).Angles.Yaw.Degrees;
      P_ForwardThrust(player,&local_48,local_78);
    }
    if ((local_68 != 0.0) || (NAN(local_68))) {
      dVar6 = local_a8 * (double)(int)(player->cmd).ucmd.sidemove * 0.00390625;
      local_58 = FFastTrig::cos(&fasttrig,
                                ((pAVar1->super_AActor).Angles.Yaw.Degrees + -90.0) *
                                11930464.711111112 + 6755399441055744.0);
      local_58 = local_58 * dVar6;
      dVar3 = FFastTrig::sin(&fasttrig,local_58);
      (player->Vel).X = local_58 + (player->Vel).X;
      (player->Vel).Y = dVar3 * dVar6 + (player->Vel).Y;
      local_38.Degrees = (pAVar1->super_AActor).Angles.Yaw.Degrees + -90.0;
      AActor::Thrust(&player->mo->super_AActor,&local_38,local_68);
    }
    if (debugfile != (FILE *)0x0) {
      uVar5 = 0x70;
      if (((uint)player->cheats >> 0xd & 1) == 0) {
        uVar5 = 0x20;
      }
      pAVar1 = player->mo;
      fprintf((FILE *)debugfile,"move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [",
              SUB84((pAVar1->super_AActor).__Pos.X,0),SUB84((pAVar1->super_AActor).__Pos.Y,0),
              (pAVar1->super_AActor).__Pos.Z,local_78,local_68._0_4_,local_88._0_4_,local_50,
              (ulong)(uint)((int)((ulong)&player[-0x91ab].ConversationNPCAngle >> 5) * 0x3cf3cf3d),
              uVar5,(ulong)(uint)(pAVar1->super_AActor).waterlevel);
      for (pmVar2 = (player->mo->super_AActor).touching_sectorlist; pmVar2 != (msecnode_t *)0x0;
          pmVar2 = pmVar2->m_tnext) {
        fprintf((FILE *)debugfile,"%td ",
                ((long)pmVar2->m_sector - (long)sectors >> 3) * -0xf4898d5f85bb395);
      }
      fwrite("]\n",2,1,(FILE *)debugfile);
    }
    if ((local_68 != 0.0 || local_78 != 0.0) && ((player->cheats & 0x2000U) == 0)) {
      APlayerPawn::PlayRunning(player->mo);
    }
    if ((char)player->cheats < '\0') {
      player->cheats = player->cheats & 0xffffff7f;
      (player->camera).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)player->mo;
    }
  }
  return;
}

Assistant:

void P_MovePlayer (player_t *player)
{
	ticcmd_t *cmd = &player->cmd;
	APlayerPawn *mo = player->mo;

	// [RH] 180-degree turn overrides all other yaws
	if (player->turnticks)
	{
		player->turnticks--;
		mo->Angles.Yaw += (180. / TURN180_TICKS);
	}
	else
	{
		mo->Angles.Yaw += cmd->ucmd.yaw * (360./65536.);
	}

	player->onground = (mo->Z() <= mo->floorz) || (mo->flags2 & MF2_ONMOBJ) || (mo->BounceFlags & BOUNCE_MBF) || (player->cheats & CF_NOCLIP2);

	// killough 10/98:
	//
	// We must apply thrust to the player and bobbing separately, to avoid
	// anomalies. The thrust applied to bobbing is always the same strength on
	// ice, because the player still "works just as hard" to move, while the
	// thrust applied to the movement varies with 'movefactor'.

	if (cmd->ucmd.forwardmove | cmd->ucmd.sidemove)
	{
		double forwardmove, sidemove;
		double bobfactor;
		double friction, movefactor;
		double fm, sm;

		movefactor = P_GetMoveFactor (mo, &friction);
		bobfactor = friction < ORIG_FRICTION ? movefactor : ORIG_FRICTION_FACTOR;
		if (!player->onground && !(player->mo->flags & MF_NOGRAVITY) && !player->mo->waterlevel)
		{
			// [RH] allow very limited movement if not on ground.
			movefactor *= level.aircontrol;
			bobfactor*= level.aircontrol;
		}

		fm = cmd->ucmd.forwardmove;
		sm = cmd->ucmd.sidemove;
		mo->TweakSpeeds (fm, sm);
		fm *= player->mo->Speed / 256;
		sm *= player->mo->Speed / 256;

		// When crouching, speed and bobbing have to be reduced
		if (player->CanCrouch() && player->crouchfactor != 1)
		{
			fm *= player->crouchfactor;
			sm *= player->crouchfactor;
			bobfactor *= player->crouchfactor;
		}

		forwardmove = fm * movefactor * (35 / TICRATE);
		sidemove = sm * movefactor * (35 / TICRATE);

		if (forwardmove)
		{
			P_Bob(player, mo->Angles.Yaw, cmd->ucmd.forwardmove * bobfactor / 256., true);
			P_ForwardThrust(player, mo->Angles.Yaw, forwardmove);
		}
		if (sidemove)
		{
			P_Bob(player, mo->Angles.Yaw - 90, cmd->ucmd.sidemove * bobfactor / 256., false);
			P_SideThrust(player, mo->Angles.Yaw, sidemove);
		}

		if (debugfile)
		{
			fprintf (debugfile, "move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [", int(player-players),
				player->cheats&CF_PREDICTING?'p':' ',
				player->mo->X(), player->mo->Y(), player->mo->Z(),forwardmove, sidemove, movefactor, friction, player->mo->waterlevel);
			msecnode_t *n = player->mo->touching_sectorlist;
			while (n != NULL)
			{
				fprintf (debugfile, "%td ", n->m_sector-sectors);
				n = n->m_tnext;
			}
			fprintf (debugfile, "]\n");
		}

		if (!(player->cheats & CF_PREDICTING) && (forwardmove != 0 || sidemove != 0))
		{
			player->mo->PlayRunning ();
		}

		if (player->cheats & CF_REVERTPLEASE)
		{
			player->cheats &= ~CF_REVERTPLEASE;
			player->camera = player->mo;
		}
	}
}